

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxTrackBuilder.cpp
# Opt level: O1

void __thiscall FluxTrackBuilder::addWeakBlock(FluxTrackBuilder *this,int length)

{
  iterator __position;
  uint uVar1;
  undefined8 in_RAX;
  int iVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  addRawBit(this,true);
  addRawBit(this,true);
  if (0 < length) {
    iVar2 = ((uint)(length * 0x15) >> 1) + 1;
    do {
      uVar1 = this->m_bitcell_ns * 3 >> 1;
      uStack_28 = CONCAT44(uVar1,(undefined4)uStack_28);
      __position._M_current =
           (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this->m_flux_times,__position,(uint *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = uVar1;
        (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  return;
}

Assistant:

void FluxTrackBuilder::addWeakBlock(int length)
{
    // Flush out previous constant block.
    addRawBit(1);
    addRawBit(1);

    // Approximately 11 ambigious reversals per weak byte.
    length = length * 21 / 2;

    while (length-- > 0)
        m_flux_times.push_back(m_bitcell_ns * 3 / 2);
}